

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

double * cardinal_cos(int j,int m,int n,double *t)

{
  double dVar1;
  double *pdVar2;
  ulong uVar3;
  double __x;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  uVar3 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar3 = (ulong)(uint)n * 8;
  }
  pdVar2 = (double *)operator_new__(uVar3);
  if (0 < n) {
    dVar1 = *(double *)(&DAT_00225e80 + (ulong)(j % (m + 1) == 0) * 8);
    dVar9 = (double)(m + 1);
    __x = ((double)j * 3.141592653589793) / dVar9;
    uVar3 = 0;
    do {
      dVar4 = 1.0;
      if (2.220446049250313e-16 < ABS(t[uVar3] - __x)) {
        dVar4 = r8_mop(j + 1);
        dVar5 = sin(t[uVar3]);
        dVar6 = sin(t[uVar3] * dVar9);
        dVar7 = cos(t[uVar3]);
        dVar8 = cos(__x);
        dVar4 = (((dVar6 * dVar5 * dVar4) / dVar1) / dVar9) / (dVar7 - dVar8);
      }
      pdVar2[uVar3] = dVar4;
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  return pdVar2;
}

Assistant:

BURKHARDT_EXPORT
double *cardinal_cos ( int j, int m, int n, double t[] )

//****************************************************************************80
//
//  Purpose:
//
//    CARDINAL_COS evaluates the J-th cardinal cosine basis function.
//
//  Discussion:
//
//    The base points are T(I) = pi * I / ( M + 1 ), 0 <= I <= M + 1.
//    Basis function J is 1 at T(J), and 0 at T(I) for I /= J
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    13 May 2014
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    John Boyd,
//    Exponentially convergent Fourier-Chebyshev quadrature schemes on
//    bounded and infinite intervals,
//    Journal of Scientific Computing,
//    Volume 2, Number 2, 1987, pages 99-109.
//
//  Parameters:
//
//    Input, int J, the index of the basis function.
//    0 <= J <= M + 1.
//
//    Input, int M, indicates the size of the basis set.
//
//    Input, int N, the number of sample points.
//
//    Input, double T[N], one or more points in [0,pi] where the
//    basis function is to be evaluated.
//
//    Output, double CARDINAL_COS[N], the value of the function at T.
//
{
  double *c;
  double cj;
  int i;
  const double r8_eps = 2.220446049250313E-016;
  const double r8_pi = 3.141592653589793;
  double tj;

  c = new double[n];

  if ( ( j % ( m + 1 ) ) == 0 )
  {
    cj = 2.0;
  }
  else
  {
    cj = 1.0;
  }

  tj = r8_pi * double( j ) / double( m + 1 );

  for ( i = 0; i < n; i++ )
  {
    if ( fabs ( t[i] - tj ) <= r8_eps )
    {
      c[i] = 1.0;
    }
    else
    {
      c[i] = r8_mop ( j + 1 ) 
        * sin ( t[i] ) 
        * sin ( double( m + 1 ) * t[i] ) 
        / cj 
        / double( m + 1 ) 
        / ( cos ( t[i] ) - cos ( tj ) );
    }
  }

  return c;
}